

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O2

void __thiscall embree::TutorialBenchmark::TutorialBenchmark(TutorialBenchmark *this,BenchFunc func)

{
  _Rb_tree_header *p_Var1;
  CommandLineParser *this_00;
  allocator local_6a;
  allocator local_69;
  anon_class_8_1_8991fb9c_for_f local_68;
  string local_60;
  string local_40;
  
  this->_vptr_TutorialBenchmark = (_func_int **)&PTR_postParseCommandLine_002acf98;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->commandLineParser).commandLineOptionList.
  super__Vector_base<embree::Ref<embree::CommandLineParser::CommandLineOption>,_std::allocator<embree::Ref<embree::CommandLineParser::CommandLineOption>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = &p_Var1->_M_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = &p_Var1->_M_header;
  (this->commandLineParser).commandLineOptionMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
       0;
  this_00 = &this->commandLineParser;
  (this->commandLineParser).verbosity = SILENT;
  std::__cxx11::string::string((string *)&this->inputFile,"",(allocator *)&local_60);
  (this->processedCommandLineOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->processedCommandLineOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->processedCommandLineOptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BenchParams::BenchParams(&this->params);
  this->func = func;
  std::__cxx11::string::string((string *)&local_60,"help",&local_69);
  local_68.this = this;
  std::__cxx11::string::string
            ((string *)&local_40,"--help: prints help for all supported command line options",
             &local_6a);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_1_>
            (this_00,&local_60,&local_68,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,"i",&local_69);
  local_68.this = this;
  std::__cxx11::string::string((string *)&local_40,"-i <filepath>: .xml ",&local_6a);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_2_>
            (this_00,&local_60,(anon_class_8_1_8991fb9c_for_f *)&local_68,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,"c",&local_69);
  local_68.this = this;
  std::__cxx11::string::string((string *)&local_40,"-c <filepath>: .ecs ",&local_6a);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_3_>
            (this_00,&local_60,(anon_class_8_1_8991fb9c_for_f *)&local_68,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,"benchmark",&local_69);
  local_68.this = this;
  std::__cxx11::string::string
            ((string *)&local_40,
             "--benchmark <N> <M>: run benchmark for M seconds (M iterations in legacy mode) with N iterations warm-up"
             ,&local_6a);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_4_>
            (this_00,&local_60,(anon_class_8_1_8991fb9c_for_f *)&local_68,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,"legacy",&local_69);
  local_68.this = this;
  std::__cxx11::string::string
            ((string *)&local_40,"--legacy: run old benchmark version (without google benchmark)",
             &local_6a);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_5_>
            (this_00,&local_60,(anon_class_8_1_8991fb9c_for_f *)&local_68,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,"benchmark_repetitions",&local_69);
  local_68.this = this;
  std::__cxx11::string::string
            ((string *)&local_40,
             "--benchmark_repetitions <R>: run R repetitions when using google benchmark",&local_6a)
  ;
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_6_>
            (this_00,&local_60,(anon_class_8_1_8991fb9c_for_f *)&local_68,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::string((string *)&local_60,"benchmark_name",&local_69);
  local_68.this = this;
  std::__cxx11::string::string
            ((string *)&local_40,"--benchmark_name <string>: override name of the benchmark",
             &local_6a);
  CommandLineParser::
  registerOption<embree::TutorialBenchmark::TutorialBenchmark(void(*)(embree::BenchState&,embree::BenchParams&,int,char**))::_lambda(embree::Ref<embree::ParseStream>,embree::FileName_const&)_7_>
            (this_00,&local_60,(anon_class_8_1_8991fb9c_for_f *)&local_68,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

TutorialBenchmark(BenchFunc func) :
    commandLineParser(CommandLineParser(CommandLineParser::SILENT)),
    func(func)
  {
    commandLineParser.registerOption("help", [this] (Ref<ParseStream> cin, const FileName& path) {
        commandLineParser.printCommandLineHelp();
        exit(1);
      }, "--help: prints help for all supported command line options");
    commandLineParser.registerOption("i", [&] (Ref<ParseStream> cin, const FileName& path) {
        inputFile = cin->getString();
      }, "-i <filepath>: .xml ");
    commandLineParser.registerOption("c", [&] (Ref<ParseStream> cin, const FileName& path) {
        inputFile = cin->getString();
      }, "-c <filepath>: .ecs ");
    commandLineParser.registerOption("benchmark", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.skipIterations = cin->getInt();
        params.minTimeOrIterations = cin->getInt();
        processedCommandLineOptions.push_back("--benchmark");
      }, "--benchmark <N> <M>: run benchmark for M seconds (M iterations in legacy mode) with N iterations warm-up");
    commandLineParser.registerOption("legacy", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.legacy = true;
        processedCommandLineOptions.push_back("--legacy");
      }, "--legacy: run old benchmark version (without google benchmark)");
    commandLineParser.registerOption("benchmark_repetitions", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.repetitions = cin->getInt();
        processedCommandLineOptions.push_back("--benchmark_repetitions");
      }, "--benchmark_repetitions <R>: run R repetitions when using google benchmark");
    commandLineParser.registerOption("benchmark_name", [&] (Ref<ParseStream> cin, const FileName& path) {
        params.name = cin->getString();
        processedCommandLineOptions.push_back("--benchmark_name");
      }, "--benchmark_name <string>: override name of the benchmark");
  }